

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O0

size_t __thiscall flow::ConstantPool::makeNativeHandler(ConstantPool *this,string *sig)

{
  size_t sVar1;
  string *sig_local;
  ConstantPool *this_local;
  
  sVar1 = ensureValue<std::__cxx11::string,std::__cxx11::string>
                    (&this->nativeHandlerSignatures_,sig);
  return sVar1;
}

Assistant:

size_t ConstantPool::makeNativeHandler(const std::string& sig) {
  return ensureValue(nativeHandlerSignatures_, sig);
}